

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributeBackToSignedType<short>
          (KdTreeAttributesDecoder *this,PointAttribute *att,int num_processed_signed_components)

{
  byte bVar1;
  size_t sVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  vector<unsigned_short,_std::allocator<unsigned_short>_> unsigned_val;
  vector<short,_std::allocator<short>_> signed_val;
  allocator_type local_59;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_58;
  _Vector_base<short,_std::allocator<short>_> local_40;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_58,
             (ulong)(att->super_GeometryAttribute).num_components_,(allocator_type *)&local_40);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_40,
             (ulong)(att->super_GeometryAttribute).num_components_,&local_59);
  for (uVar5 = 0; uVar5 < att->num_unique_entries_; uVar5 = uVar5 + 1) {
    sVar2 = (att->super_GeometryAttribute).byte_stride_;
    memcpy(local_58._M_impl.super__Vector_impl_data._M_start,
           (void *)((long)(((att->super_GeometryAttribute).buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                    (att->super_GeometryAttribute).byte_offset_ + sVar2 * uVar5),sVar2);
    bVar1 = (att->super_GeometryAttribute).num_components_;
    piVar3 = (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
      local_40._M_impl.super__Vector_impl_data._M_start[uVar4] =
           local_58._M_impl.super__Vector_impl_data._M_start[uVar4] +
           (short)piVar3[(long)num_processed_signed_components + uVar4];
    }
    sVar2 = (att->super_GeometryAttribute).byte_stride_;
    memcpy((void *)(sVar2 * uVar5 +
                   (long)(((att->super_GeometryAttribute).buffer_)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start),
           local_40._M_impl.super__Vector_impl_data._M_start,sVar2);
  }
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_40);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_58);
  return true;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributeBackToSignedType(
    PointAttribute *att, int num_processed_signed_components) {
  typedef typename std::make_unsigned<SignedDataTypeT>::type UnsignedType;
  std::vector<UnsignedType> unsigned_val(att->num_components());
  std::vector<SignedDataTypeT> signed_val(att->num_components());

  for (AttributeValueIndex avi(0); avi < static_cast<uint32_t>(att->size());
       ++avi) {
    att->GetValue(avi, &unsigned_val[0]);
    for (int c = 0; c < att->num_components(); ++c) {
      // Up-cast |unsigned_val| to int32_t to ensure we don't overflow it for
      // smaller data types. But first check that the up-casting does not cause
      // signed integer overflow.
      if (unsigned_val[c] > std::numeric_limits<int32_t>::max()) {
        return false;
      }
      signed_val[c] = static_cast<SignedDataTypeT>(
          static_cast<int32_t>(unsigned_val[c]) +
          min_signed_values_[num_processed_signed_components + c]);
    }
    att->SetAttributeValue(avi, &signed_val[0]);
  }
  return true;
}